

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall CExtKey::Encode(CExtKey *this,uchar *code)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uchar *puVar10;
  byte *pbVar11;
  undefined1 *in_RSI;
  CKey *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uchar *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = in_RDI->fCompressed;
  *(undefined4 *)(in_RSI + 1) = *(undefined4 *)&in_RDI->field_0x1;
  WriteBE32(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  puVar10 = base_blob<256U>::begin
                      ((base_blob<256U> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(undefined8 *)(in_RSI + 9) = *(undefined8 *)puVar10;
  *(undefined8 *)(in_RSI + 0x11) = *(undefined8 *)(puVar10 + 8);
  *(undefined8 *)(in_RSI + 0x19) = *(undefined8 *)(puVar10 + 0x10);
  *(undefined8 *)(in_RSI + 0x21) = *(undefined8 *)(puVar10 + 0x18);
  in_RSI[0x29] = 0;
  uVar9 = CKey::size(in_RDI);
  if (uVar9 != 0x20) {
    __assert_fail("key.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x18c,"void CExtKey::Encode(unsigned char *) const");
  }
  pbVar11 = CKey::begin((CKey *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar2 = *(undefined4 *)pbVar11;
  uVar3 = *(undefined4 *)(pbVar11 + 4);
  uVar4 = *(undefined4 *)(pbVar11 + 8);
  uVar5 = *(undefined4 *)(pbVar11 + 0xc);
  uVar6 = *(undefined4 *)(pbVar11 + 0x14);
  uVar7 = *(undefined4 *)(pbVar11 + 0x18);
  uVar8 = *(undefined4 *)(pbVar11 + 0x1c);
  *(undefined4 *)(in_RSI + 0x3a) = *(undefined4 *)(pbVar11 + 0x10);
  *(undefined4 *)(in_RSI + 0x3e) = uVar6;
  *(undefined4 *)(in_RSI + 0x42) = uVar7;
  *(undefined4 *)(in_RSI + 0x46) = uVar8;
  *(undefined4 *)(in_RSI + 0x2a) = uVar2;
  *(undefined4 *)(in_RSI + 0x2e) = uVar3;
  *(undefined4 *)(in_RSI + 0x32) = uVar4;
  *(undefined4 *)(in_RSI + 0x36) = uVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtKey::Encode(unsigned char code[BIP32_EXTKEY_SIZE]) const {
    code[0] = nDepth;
    memcpy(code+1, vchFingerprint, 4);
    WriteBE32(code+5, nChild);
    memcpy(code+9, chaincode.begin(), 32);
    code[41] = 0;
    assert(key.size() == 32);
    memcpy(code+42, key.begin(), 32);
}